

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::MessageLite::ParseFromArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  LogMessage *other;
  MessageLite *message;
  undefined1 uVar2;
  LogFinisher local_b1;
  CodedInputStream input;
  string local_60;
  LogMessage local_40;
  
  input.input_ = (ZeroCopyInputStream *)0x0;
  input.buffer_end_ = (uint8 *)((long)data + (long)size);
  input.overflow_bytes_ = 0;
  input.last_tag_ = 0;
  input.legitimate_message_end_ = false;
  input.aliasing_enabled_ = false;
  input.buffer_size_after_limit_ = 0;
  input.total_bytes_limit_ = 0x4000000;
  input.total_bytes_warning_threshold_ = 0x2000000;
  input.recursion_depth_ = 0;
  input.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  input.extension_pool_ = (DescriptorPool *)0x0;
  input.extension_factory_ = (MessageFactory *)0x0;
  input.buffer_ = (uint8 *)data;
  input.total_bytes_read_ = size;
  input.current_limit_ = size;
  (*this->_vptr_MessageLite[4])();
  iVar1 = (*this->_vptr_MessageLite[8])(this,&input);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_MessageLite[5])(this);
    if ((char)iVar1 != '\0') {
      uVar2 = input.legitimate_message_end_;
      goto LAB_0011dfaa;
    }
    message = (MessageLite *)0x7b;
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x7b);
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_60,(_anonymous_namespace_ *)"parse",(char *)this,message);
    other = internal::LogMessage::operator<<(&local_40,&local_60);
    internal::LogFinisher::operator=(&local_b1,other);
    std::__cxx11::string::~string((string *)&local_60);
    internal::LogMessage::~LogMessage(&local_40);
  }
  uVar2 = 0;
LAB_0011dfaa:
  io::CodedInputStream::~CodedInputStream(&input);
  return (bool)uVar2;
}

Assistant:

bool MessageLite::ParseFromArray(const void* data, int size) {
  return InlineParseFromArray(data, size, this);
}